

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O2

buffer_appender<char> __thiscall
fmt::v7::detail::fallback_formatter<diy::DynamicPoint<float,4ul>,char,void>::
format<fmt::v7::detail::buffer_appender<char>>
          (fallback_formatter<diy::DynamicPoint<float,4ul>,char,void> *this,
          DynamicPoint<float,_4UL> *value,
          basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx)

{
  iterator iVar1;
  basic_string_view<char> str;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  basic_string_view<char> local_238;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_228;
  
  local_228.super_buffer<char>.ptr_ = local_228.store_;
  local_228.super_buffer<char>.size_ = 0;
  local_228.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_001cf690;
  local_228.super_buffer<char>.capacity_ = 500;
  format_value<char,diy::DynamicPoint<float,4ul>>
            (&local_228.super_buffer<char>,value,(locale_ref)(ctx->loc_).locale_);
  local_238.data_ = local_228.super_buffer<char>.ptr_;
  local_238.size_ = local_228.super_buffer<char>.size_;
  iVar1 = formatter<fmt::v7::basic_string_view<char>,char,void>::
          format<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                    ((formatter<fmt::v7::basic_string_view<char>,char,void> *)this,&local_238,ctx);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&local_228);
  return (buffer_appender<char>)
         iVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

auto format(const T& value, basic_format_context<OutputIt, Char>& ctx)
      -> OutputIt {
    basic_memory_buffer<Char> buffer;
    format_value(buffer, value, ctx.locale());
    basic_string_view<Char> str(buffer.data(), buffer.size());
    return formatter<basic_string_view<Char>, Char>::format(str, ctx);
  }